

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::loadPLY(SceneGraph *this,FileName *fileName)

{
  PlyParser local_280;
  
  PlyParser::PlyParser(&local_280,fileName);
  *(Node **)this = local_280.scene.ptr;
  local_280.scene.ptr = (Node *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
  ::~_Rb_tree(&local_280.mesh.elements._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_280.mesh.order);
  std::fstream::~fstream(&local_280);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<Node> loadPLY(const FileName& fileName) {
      return PlyParser(fileName).scene;
    }